

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  block_type_t bVar1;
  list_t *plVar2;
  void *pvVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  gbspace_t gVar8;
  option_t *poVar9;
  size_t sVar10;
  char *pcVar11;
  sourcefile_t *psVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  block_header_t *pbVar16;
  reloc_entry_t *data;
  symbol_entry_t *data_00;
  section_entry_t *psVar17;
  list_t *plVar18;
  section_entry_t *psVar19;
  FILE *pFVar20;
  uchar *__ptr;
  long lVar21;
  char *pcVar22;
  char cVar23;
  uint uVar24;
  list_s *plVar25;
  list_t **pplVar26;
  int iVar27;
  list_s **pplVar28;
  int *piVar29;
  int iVar30;
  list_t **pplVar31;
  list_s **local_48;
  
  esetprogram("gbld");
  esetonfatal(on_fatal_error);
  parse_options(argc,argv,2,help,version);
  iVar7 = errors();
  if (iVar7 == 0) {
    poVar9 = get_option("-o");
    sVar10 = strlen((poVar9->value).str);
    pcVar11 = (char *)mmalloc(sVar10 + 1);
    poVar9 = get_option("-o");
    strcpy(pcVar11,(poVar9->value).str);
    poVar9 = get_option("-g");
    iVar7 = poVar9->set;
    init_rom();
    file_first();
    pplVar26 = &lsections;
    local_48 = &lsymbols;
    pplVar31 = &lrelocations;
    iVar30 = 0;
    while (psVar12 = file_next(), psVar12 != (sourcefile_t *)0x0) {
      esetfile(psVar12->name);
      infile = (FILE *)fopen(psVar12->name,"rb");
      if ((FILE *)infile == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",psVar12->name);
      }
      else {
        fseek((FILE *)infile,0,2);
        uVar13 = ftell((FILE *)infile);
        fseek((FILE *)infile,0,0);
        set_infile(infile);
        read_obj_header();
        sVar10 = strlen(psVar12->name);
        pcVar14 = (char *)mmalloc(sVar10 + 1);
        strcpy(pcVar14,psVar12->name);
        list_add(&lfiles,iVar30,pcVar14,0);
        while (uVar15 = ftell((FILE *)infile), uVar15 < uVar13) {
          pbVar16 = read_block_header();
          init_map();
          bVar1 = pbVar16->type;
          if (bVar1 == sections) {
            for (iVar27 = 0; iVar27 < pbVar16->num_entries; iVar27 = iVar27 + 1) {
              psVar17 = read_section_entry();
              list_add(&lsections,iVar30,psVar17,0);
            }
          }
          else if (bVar1 == symbols) {
            for (iVar27 = 0; iVar27 < pbVar16->num_entries; iVar27 = iVar27 + 1) {
              data_00 = read_symbol_entry();
              list_add(&lsymbols,iVar30,data_00,iVar30);
            }
          }
          else if (bVar1 == relocations) {
            for (iVar27 = 0; iVar27 < pbVar16->num_entries; iVar27 = iVar27 + 1) {
              data = read_reloc_entry();
              list_add(&lrelocations,iVar30,data,0);
            }
          }
        }
        fclose((FILE *)infile);
        iVar30 = iVar30 + 1;
      }
    }
    while (plVar2 = *local_48, plVar2 != (list_t *)0x0) {
      local_48 = &plVar2->next;
      pplVar28 = local_48;
      while (plVar25 = *pplVar28, plVar25 != (list_s *)0x0) {
        if (((plVar2->file_id != plVar25->file_id) && (*(int *)((long)plVar2->data + 0x2c) == 1)) &&
           (*(int *)((long)plVar25->data + 0x2c) == 1)) {
          pcVar14 = (char *)((long)plVar25->data + 4);
          iVar30 = strcmp((char *)((long)plVar2->data + 4),pcVar14);
          if (iVar30 == 0) {
            ccerr(E,"duplicate symbol \'%s\'",pcVar14);
          }
        }
        pplVar28 = &plVar25->next;
      }
    }
    while (plVar2 = *pplVar26, plVar2 != (list_t *)0x0) {
      plVar18 = list_at(lfiles,plVar2->file_id);
      psVar17 = (section_entry_t *)plVar2->data;
      esetfile((char *)plVar18->data);
      if (psVar17->type == org) {
        uVar24 = allocate((char *)plVar18->data,psVar17);
        psVar17->offset = uVar24;
        plVar2->flags = 1;
      }
      pplVar26 = &plVar2->next;
    }
    pplVar26 = &lsymbols;
    while (plVar2 = *pplVar26, plVar2 != (list_t *)0x0) {
      plVar18 = list_at(lfiles,plVar2->file_id);
      plVar25 = lsymbols;
      pvVar3 = plVar2->data;
      if (*(int *)((long)pvVar3 + 0x2c) == 2) {
        esetfile((char *)plVar18->data);
        for (; plVar25 != (list_t *)0x0; plVar25 = plVar25->next) {
          iVar30 = plVar25->file_id;
          if (((plVar2->file_id != iVar30) &&
              (pvVar4 = plVar25->data, *(int *)((long)pvVar4 + 0x2c) == 1)) &&
             (iVar27 = strcmp((char *)((long)pvVar3 + 4),(char *)((long)pvVar4 + 4)), iVar27 == 0))
          {
            plVar2->flags = iVar30;
            *(undefined8 *)((long)pvVar3 + 0x24) = *(undefined8 *)((long)pvVar4 + 0x24);
            goto LAB_001026f4;
          }
        }
        err(E,"symbol \'%s\' unsolved",(char *)((long)pvVar3 + 4));
      }
LAB_001026f4:
      pplVar26 = &plVar2->next;
    }
    while (plVar2 = *pplVar31, plVar2 != (list_t *)0x0) {
      plVar18 = list_at(lfiles,plVar2->file_id);
      plVar25 = lsymbols;
      piVar5 = (int *)plVar2->data;
      esetfile((char *)plVar18->data);
      for (; plVar25 != (list_t *)0x0; plVar25 = plVar25->next) {
        iVar30 = plVar25->file_id;
        if ((iVar30 == plVar2->file_id) &&
           (piVar29 = (int *)plVar25->data, *plVar25->data == *piVar5)) goto LAB_00102782;
      }
      err(F,"relocation entries corrupted");
      iVar30 = plVar2->file_id;
      piVar29 = _DAT_00000008;
LAB_00102782:
      psVar17 = get_section(iVar30,piVar5[1]);
      psVar19 = get_section((&plVar25->file_id)[(ulong)(piVar29[0xb] == 2) * 4],piVar29[9]);
      iVar30 = piVar29[10] + psVar19->offset;
      if (piVar5[3] == 1) {
        uVar24 = ~(psVar17->offset + piVar5[2]);
        psVar17->data[piVar5[2]] = (uchar)iVar30 + (char)uVar24;
        if ((iVar30 + uVar24) - 0x81 < 0xffffff00) {
          err(E,"relative jump to \'%s\' out of reach",piVar29 + 1);
        }
      }
      else {
        psVar17->data[piVar5[2]] = (uchar)iVar30;
        psVar17->data[(long)piVar5[2] + 1] = (uchar)((uint)iVar30 >> 8);
      }
      pplVar31 = &plVar2->next;
    }
    pplVar26 = &lsections;
    while ((plVar2 = *pplVar26, plVar2 != (list_t *)0x0 && (iVar30 = errors(), iVar30 == 0))) {
      write_section((section_entry_t *)plVar2->data);
      pplVar26 = &plVar2->next;
    }
    iVar30 = errors();
    if (iVar30 == 0) {
      pFVar20 = fopen(pcVar11,"wb");
      if (pFVar20 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",pcVar11);
      }
      fix_rom();
      for (iVar30 = 0; iVar27 = get_num_rom_banks(), iVar30 < iVar27; iVar30 = iVar30 + 1) {
        __ptr = get_rom_bank(iVar30);
        fwrite(__ptr,0x4000,1,pFVar20);
      }
      fclose(pFVar20);
    }
    iVar30 = 0;
    iVar27 = errors();
    if ((iVar27 == 0) && (iVar7 != 0)) {
      lVar21 = -1;
      do {
        lVar6 = lVar21 + 1;
        lVar21 = lVar21 + 1;
      } while (pcVar11[lVar6] != '\0');
      cVar23 = '\0';
      for (; (cVar23 != '.' && (lVar21 != 0)); lVar21 = lVar21 + -1) {
        cVar23 = pcVar11[lVar21 + -1];
      }
      if (cVar23 == '.') {
        pcVar11[lVar21] = '\0';
      }
      sVar10 = strlen(pcVar11);
      pcVar14 = (char *)mrealloc(pcVar11,sVar10 + 4);
      pcVar11 = pcVar14;
      do {
        pcVar22 = pcVar11;
        pcVar11 = pcVar22 + 1;
      } while (*pcVar22 != '\0');
      builtin_strncpy(pcVar22,".sym",4);
      plVar25 = lsymbols;
      pFVar20 = fopen(pcVar14,"w");
      if (pFVar20 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",pcVar14);
      }
      while ((plVar25 != (list_t *)0x0 && (iVar7 = errors(), iVar7 == 0))) {
        pvVar3 = plVar25->data;
        if (*(int *)((long)pvVar3 + 0x2c) != 2) {
          psVar17 = get_section(plVar25->file_id,*(uint *)((long)pvVar3 + 0x24));
          gVar8 = get_space(psVar17->offset);
          fprintf(pFVar20,"%02X:%04X %s\n",(ulong)((uint)(gVar8 == rom_n) + psVar17->bank_num),
                  (ulong)(uint)(*(int *)((long)pvVar3 + 0x28) + psVar17->offset),(long)pvVar3 + 4);
        }
        plVar25 = plVar25->next;
      }
      fclose(pFVar20);
    }
    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);
  }
  else {
    iVar30 = 1;
  }
  return iVar30;
}

Assistant:

int main(int argc, char** argv)
{
    int i, file_id = 0;
    unsigned numsect = 0, numsyms = 0, numrelocs = 0;
    list_t* list;
    sourcefile_t* file = NULL;
    char* output_name = NULL;
    FILE* outfile = NULL;
    list_t* psyms1, * psyms2;
    int gen_debug = 0;


    esetprogram(pgm);
    esetonfatal(&on_fatal_error);

    parse_options(argc, argv, GBLD, &help, &version);

    if (errors())
        return EXIT_FAILURE;

    output_name = (char*)mmalloc(strlen(get_option("-o")->value.str) + 1);
    strcpy(output_name, get_option("-o")->value.str);

    gen_debug = get_option("-g")->set;

    init_rom();

    file_first();
    while ((file = file_next()))
    {
        size_t fsize;
        char* filename;
        esetfile(file->name);
        if (! (infile = fopen(file->name, "rb")))
        {
            ccerr(F, "unable to open \"%s\"", file->name);
            continue;
        }

        fseek(infile, 0, SEEK_END);
        fsize = ftell(infile);
        fseek(infile, 0, SEEK_SET);

        set_infile(infile);
        read_obj_header();

        filename = (char*)mmalloc(strlen(file->name) + 1);
        strcpy(filename, file->name);
        list_add(&lfiles, file_id, filename, 0);

        while (ftell(infile) < fsize)
        {
            block_header_t* header= read_block_header();
            init_map();

            if (header->type == sections)
            {
                section_entry_t* sect;
#ifndef NDEBUG
                printf("New sections block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    unsigned k;
                    sect = read_section_entry();
                    list_add(&lsections, file_id, sect, 0);
                    ++numsect;
#ifndef NDEBUG
                    printf("  * Section %d\n", sect->id);
                    printf("    - Type:      %s\n", sect->type == org ? ".org" : "");
                    printf("    - Offset:    %04x\n", sect->offset);
                    printf("    - Bank:      %d\n", sect->bank_num);
                    printf("    - Data size: %d\n", sect->data_size);
                    for (k = 0; k < sect->data_size; ++k)
                    {
                        if (k && (k % 16) == 0)
                            printf("\n");
                        else if (k && (k % 8) == 0)
                            printf(" ");
                        printf("%02X ", sect->data[k]);

                    }
                    printf("\n");
#endif
                }
            }
            else if (header->type == symbols)
            {
                symbol_entry_t* sym;
#ifndef NDEBUG
                printf("New symbols block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    sym = read_symbol_entry();
                    list_add(&lsymbols, file_id, sym, file_id);
                    ++numsyms;
#ifndef NDEBUG
                    printf("  * Symbol %d\n", sym->sym_id);
                    printf("    - ID:         %s\n", sym->id);
                    printf("    - In section: %d\n", sym->section_id);
                    printf("    - Offset:     %d\n", sym->offset);
                    printf("    - Type:       %c\n", ".GE"[sym->type]);
                    printf("\n");
#endif
                }
            }
            else if (header->type == relocations)
            {
                reloc_entry_t* reloc;
#ifndef NDEBUG
                printf("New relocations block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    reloc = read_reloc_entry();
                    ++numrelocs;
                    list_add(&lrelocations, file_id, reloc, 0);
#ifndef NDEBUG
                    printf("  * Relocation\n");
                    printf("    - Symbol: %d\n", reloc->sym_id);
                    printf("    - Section: %d\n", reloc->section_id);
                    printf("    - Offset: %d\n", reloc->offset);
#endif
                }
            }
        }

        fclose(infile);
        ++file_id;
    }

    /* Search for duplicate global symbols */
    psyms1 = lsymbols;
    while (psyms1)
    {
        psyms2 = psyms1->next;
        while (psyms2)
        {
            if (psyms1->file_id == psyms2->file_id)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (((symbol_entry_t*)(psyms1->data))->type != _global
                || ((symbol_entry_t*)(psyms2->data))->type != _global)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (strcmp((const char*)((symbol_entry_t*)(psyms1->data))->id,
                       (const char*)((symbol_entry_t*)(psyms2->data))->id)
                == 0)
            {
                ccerr(E, "duplicate symbol '%s'",
                    ((symbol_entry_t*)(psyms2->data))->id);
            }

            psyms2 = psyms2->next;
        }
        psyms1 = psyms1->next;
    }

    /* .org allocation */
    list = lsections;
    while (list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        section_entry_t* sect = (section_entry_t*)list->data;
        esetfile(sfile->data);

        if (sect->type != org)
        {
            list = list->next;
            continue;
        }

        sect->offset = allocate(sfile->data, sect);
        list->flags = SECT_TREATED;

        list = list->next;
    }

    TODO("rom/ram/wram/vram + offset");
    TODO("rom/ram/wram/vram");

    /* link extern symbols */
    list = lsymbols;
    while(list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        symbol_entry_t* sym = (symbol_entry_t*)(list->data);
        list_t* tsyms = lsymbols; /* target symbols list */
        symbol_entry_t* tsym;     /* target symbol */

        if (sym->type != _extern)
        {
            list = list->next;
            continue;
        }

        esetfile((char*)sfile->data);
        while (tsyms)
        {
            tsym = (symbol_entry_t*)(tsyms->data);
            if (list->file_id == tsyms->file_id || tsym->type != _global)
            {
                tsyms = tsyms->next;
                continue;
            }

            if (strcmp((char*)sym->id, (char*)tsym->id) == 0)
                break;

            tsyms = tsyms->next;
        }

        if (tsyms == NULL)
            err(E, "symbol '%s' unsolved", sym->id);
        else
        {
            list->flags = tsyms->file_id; /* flag = target file id */
            sym->section_id = tsym->section_id;
            sym->offset = tsym->offset;
        }

        list = list->next;
    }

    /* relocs */
    list = lrelocations;
    while (list)
    {
        list_t* lfile = list_at(lfiles, list->file_id);
        reloc_entry_t* reloc = (reloc_entry_t*)(list->data);
        list_t* target_syms = lsymbols;
        symbol_entry_t* target_sym;
        section_entry_t* reloc_sect;
        section_entry_t* symbol_sect;
        int target_addr;

        esetfile((char*)lfile->data);

        /* search for target symbol among symbols created in the same file */
        while (target_syms)
        {
            if (target_syms->file_id != list->file_id)
            {
                target_syms = target_syms->next;
                continue;
            }
            if (((symbol_entry_t*)(target_syms->data))->sym_id == reloc->sym_id)
                break;
            target_syms = target_syms->next;
        }

        if (target_syms == NULL)
            err(F, "relocation entries corrupted");

        target_sym = (symbol_entry_t*)(target_syms->data);
        reloc_sect = get_section(list->file_id, reloc->section_id);
        if (target_sym->type == _extern)
            symbol_sect = get_section(target_syms->flags, target_sym->section_id);
        else
            symbol_sect = get_section(target_syms->file_id, target_sym->section_id);


        target_addr = symbol_sect->offset + target_sym->offset;
        if (reloc->flags == relative)
        {
            int jr = target_addr - (reloc_sect->offset + reloc->offset + 1);
            reloc_sect->data[reloc->offset] = jr;
            if (jr > 128 || jr < -127)
                err(E, "relative jump to '%s' out of reach", target_sym->id);
        }
        else
        {
            reloc_sect->data[reloc->offset] = target_addr & 0xFF;
            reloc_sect->data[reloc->offset + 1] = (target_addr >> 8) & 0xFF;
        }

        list = list->next;
    }

    /* Write sections to rom banks */
    list = lsections;
    while (list && !errors())
    {
        write_section((section_entry_t*)(list->data));
        list = list->next;
    }

    if (!errors())
    {
        if ( ! (outfile = fopen(output_name, "wb")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        fix_rom();
        for (i = 0; i < get_num_rom_banks(); ++i)
            fwrite(get_rom_bank(i), ROM_BANK_SIZE, 1, outfile);
        fclose(outfile);
    }

    /* Write sym file */
    if (!errors() && gen_debug)
    {
        symbol_entry_t* syms;
        section_entry_t* sect;
        int bank_num;
        char* p = output_name;

        while (*p)
            ++p;
        while (*p != '.' && p != output_name)
            --p;
        if (*p == '.')
            *p = 0;
        output_name = (char*)mrealloc(output_name, strlen(output_name) + 4);
        p = output_name;
        while (*p != 0)
            ++p;
        *p++ = '.';
        *p++ = 's';
        *p++ = 'y';
        *p++ = 'm';
        list = lsymbols;

        if ( ! (outfile = fopen(output_name, "w")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        while (list && !errors())
        {
            syms = (symbol_entry_t*)(list->data);
            if (syms->type != _extern)
            {
                sect = get_section(list->file_id, syms->section_id);
                if (get_space(sect->offset) == rom_n)
                    bank_num = sect->bank_num + 1;
                else
                    bank_num = sect->bank_num;
                fprintf(outfile, "%02X:%04X %s\n", bank_num,
                       sect->offset + syms->offset, syms->id);
            }
            list = list->next;
        }

        fclose(outfile);
    }

    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);

    return EXIT_SUCCESS;
}